

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

any __thiscall cs_impl::any::make<cs::type_id,std::type_info_const&>(any *this,type_info *args)

{
  baseHolder *pbVar1;
  proxy *ppVar2;
  
  if ((DAT_00266a48 == 0) || (cs::global_thread_counter != 0)) {
    pbVar1 = (baseHolder *)operator_new(0x18);
  }
  else {
    pbVar1 = (baseHolder *)(&cs::null_pointer)[DAT_00266a48];
    DAT_00266a48 = DAT_00266a48 + -1;
  }
  pbVar1->_vptr_baseHolder = (_func_int **)&PTR__baseHolder_0025cf28;
  pbVar1[1]._vptr_baseHolder = (_func_int **)args;
  pbVar1[2]._vptr_baseHolder = (_func_int **)0x0;
  if ((DAT_002680d0 == 0) || (cs::global_thread_counter != 0)) {
    ppVar2 = (proxy *)operator_new(0x18);
  }
  else {
    ppVar2 = (proxy *)(&cs::null_pointer)[DAT_002680d0];
    DAT_002680d0 = DAT_002680d0 + -1;
  }
  ppVar2->is_rvalue = false;
  ppVar2->protect_level = 0;
  ppVar2->refcount = 1;
  ppVar2->data = pbVar1;
  this->mDat = ppVar2;
  return (any)(proxy *)this;
}

Assistant:

static any make(ArgsT &&...args)
		{
			return any(allocator.alloc(1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}